

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall
Js::FunctionExecutionStateMachine::VerifyExecutionModeLimits(FunctionExecutionStateMachine *this)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar5 [16];
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x339,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_0077ffde;
    *puVar4 = 0;
    in_XMM0 = extraout_XMM0;
  }
  uVar1._0_2_ = this->interpreterLimit;
  uVar1._2_2_ = this->autoProfilingInterpreter0Limit;
  uVar1._4_2_ = this->profilingInterpreter0Limit;
  uVar1._6_2_ = this->autoProfilingInterpreter1Limit;
  auVar5 = pmovzxwd(in_XMM0,uVar1);
  auVar5 = phaddd(auVar5,auVar5);
  auVar5 = phaddd(auVar5,auVar5);
  if (auVar5._0_4_ + (uint)this->profilingInterpreter1Limit + (uint)this->simpleJitLimit !=
      (uint)this->fullJitThreshold) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x342,
                                "(( interpreterLimit + autoProfilingInterpreter0Limit + profilingInterpreter0Limit + autoProfilingInterpreter1Limit + simpleJitLimit + profilingInterpreter1Limit ) == fullJitThreshold)"
                                ,
                                "( interpreterLimit + autoProfilingInterpreter0Limit + profilingInterpreter0Limit + autoProfilingInterpreter1Limit + simpleJitLimit + profilingInterpreter1Limit ) == fullJitThreshold"
                               );
    if (!bVar3) {
LAB_0077ffde:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::VerifyExecutionModeLimits() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(
            (
                interpreterLimit +
                autoProfilingInterpreter0Limit +
                profilingInterpreter0Limit +
                autoProfilingInterpreter1Limit +
                simpleJitLimit +
                profilingInterpreter1Limit
                ) == fullJitThreshold);
    }